

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O0

bool __thiscall cppcms::plugin::scope::is_loaded_by_this_scope(scope *this,string *module)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
  *in_RDI;
  _Self local_20;
  _Self local_18 [3];
  
  booster::hold_ptr<cppcms::plugin::scope::_data>::operator->
            ((hold_ptr<cppcms::plugin::scope::_data> *)in_RDI);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
       ::find(in_RDI,(key_type *)0x4731cd);
  booster::hold_ptr<cppcms::plugin::scope::_data>::operator->
            ((hold_ptr<cppcms::plugin::scope::_data> *)in_RDI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(local_18,&local_20);
  return bVar1;
}

Assistant:

bool scope::is_loaded_by_this_scope(std::string const &module) const
{
	return d->objects.find(module)!=d->objects.end();
}